

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

ImfLut * ImfNewRoundNBitLut(uint n,int channels)

{
  ImfLut *this;
  
  this = (ImfLut *)operator_new(0x10);
  halfFunction<Imath_3_2::half>::halfFunction<Imf_3_4::roundNBit>
            ((halfFunction<Imath_3_2::half> *)this,(roundNBit)n,(half)0xfbff,(half)0x7bff,(half)0x0,
             (half)0x7c00,(half)0xfc00,(half)0x7fff);
  *(int *)(this + 8) = channels;
  return this;
}

Assistant:

ImfLut*
ImfNewRoundNBitLut (unsigned int n, int channels)
{
    try
    {
        return (ImfLut*) new OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaLut (
            OPENEXR_IMF_INTERNAL_NAMESPACE::roundNBit (n),
            OPENEXR_IMF_INTERNAL_NAMESPACE::RgbaChannels (channels));
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}